

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_hpf_uninit(ma_hpf *pHPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ulong uVar1;
  long lVar2;
  
  if (pHPF != (ma_hpf *)0x0) {
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < pHPF->hpf1Count; uVar1 = uVar1 + 1) {
      ma_hpf1_uninit((ma_hpf1 *)((long)&pHPF->pHPF1->format + lVar2),pAllocationCallbacks);
      lVar2 = lVar2 + 0x28;
    }
    lVar2 = 0;
    for (uVar1 = 0; uVar1 < pHPF->hpf2Count; uVar1 = uVar1 + 1) {
      ma_hpf2_uninit((ma_hpf2 *)((long)&(pHPF->pHPF2->bq).format + lVar2),pAllocationCallbacks);
      lVar2 = lVar2 + 0x40;
    }
    if (pHPF->_ownsHeap != 0) {
      ma_free(pHPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_hpf_uninit(ma_hpf* pHPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return;
    }

    for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
        ma_hpf1_uninit(&pHPF->pHPF1[ihpf1], pAllocationCallbacks);
    }

    for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
        ma_hpf2_uninit(&pHPF->pHPF2[ihpf2], pAllocationCallbacks);
    }

    if (pHPF->_ownsHeap) {
        ma_free(pHPF->_pHeap, pAllocationCallbacks);
    }
}